

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestEventListener * __thiscall
testing::internal::TestEventRepeater::Release(TestEventRepeater *this,TestEventListener *listener)

{
  pointer ppTVar1;
  long lVar2;
  size_t i;
  long lVar3;
  
  ppTVar1 = (this->listeners_).
            super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = 0;
  lVar3 = 0;
  while( true ) {
    if ((long)(this->listeners_).
              super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3 == lVar3) {
      return (TestEventListener *)0x0;
    }
    if (ppTVar1[lVar3] == listener) break;
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x100000000;
  }
  std::vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>::erase
            (&this->listeners_,(TestEventListener **)((long)ppTVar1 + (lVar2 >> 0x1d)));
  return listener;
}

Assistant:

TestEventListener* TestEventRepeater::Release(TestEventListener* listener) {
  for (size_t i = 0; i < listeners_.size(); ++i) {
    if (listeners_[i] == listener) {
      listeners_.erase(listeners_.begin() + static_cast<int>(i));
      return listener;
    }
  }

  return nullptr;
}